

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int ptls_openssl_init_sign_certificate(ptls_openssl_sign_certificate_t *self,EVP_PKEY *key)

{
  int iVar1;
  st_ptls_openssl_signature_scheme_t *psVar2;
  
  (self->super).cb = sign_certificate;
  self->key = (EVP_PKEY *)0x0;
  self->schemes = (st_ptls_openssl_signature_scheme_t *)0x0;
  psVar2 = lookup_signature_schemes(key);
  self->schemes = psVar2;
  if (psVar2 == (st_ptls_openssl_signature_scheme_t *)0x0) {
    iVar1 = 0x204;
  }
  else {
    EVP_PKEY_up_ref(key);
    self->key = key;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ptls_openssl_init_sign_certificate(ptls_openssl_sign_certificate_t *self, EVP_PKEY *key)
{
    *self = (ptls_openssl_sign_certificate_t){{sign_certificate}};

    if ((self->schemes = lookup_signature_schemes(key)) == NULL)
        return PTLS_ERROR_INCOMPATIBLE_KEY;
    EVP_PKEY_up_ref(key);
    self->key = key;

    return 0;
}